

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapiex.c
# Opt level: O2

int buildBufferIfNotExist
              (BUFFER_HANDLE originalRequestContent,_Bool *isOriginalRequestContent,
              BUFFER_HANDLE *toBeUsedRequestContent)

{
  BUFFER_HANDLE pBVar1;
  
  if (originalRequestContent == (BUFFER_HANDLE)0x0) {
    pBVar1 = BUFFER_new();
    *toBeUsedRequestContent = pBVar1;
    if (pBVar1 == (BUFFER_HANDLE)0x0) {
      return 0xd9;
    }
    *isOriginalRequestContent = false;
  }
  else {
    *isOriginalRequestContent = true;
    *toBeUsedRequestContent = originalRequestContent;
  }
  return 0;
}

Assistant:

static int buildBufferIfNotExist(BUFFER_HANDLE originalRequestContent, bool* isOriginalRequestContent, BUFFER_HANDLE* toBeUsedRequestContent)
{
    int result;
    if (originalRequestContent == NULL)
    {
        *toBeUsedRequestContent = BUFFER_new();
        if (*toBeUsedRequestContent == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            *isOriginalRequestContent = false;
            result = 0;
        }
    }
    else
    {
        *isOriginalRequestContent = true;
        *toBeUsedRequestContent = originalRequestContent;
        result = 0;
    }
    return result;
}